

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

char * print_number(cJSON *item,printbuffer *p)

{
  double __x;
  char *pcVar1;
  char *__format;
  double dVar2;
  double dVar3;
  
  __x = item->valuedouble;
  if ((__x != 0.0) || (NAN(__x))) {
    if ((__x < -2147483648.0) ||
       ((2147483647.0 < __x || (2.220446049250313e-16 < ABS((double)item->valueint - __x))))) {
      if (p == (printbuffer *)0x0) {
        pcVar1 = (char *)(*cJSON_malloc)(0x40);
      }
      else {
        pcVar1 = ensure(p,0x40);
      }
      if (pcVar1 != (char *)0x0) {
        dVar2 = floor(__x);
        dVar3 = ABS(__x);
        if ((1e+60 <= dVar3) || (2.220446049250313e-16 < ABS(dVar2 - __x))) {
          if ((dVar3 < 1e-06) || (1000000000.0 < dVar3)) {
            __format = "%e";
          }
          else {
            __format = "%f";
          }
        }
        else {
          __format = "%.0f";
        }
        sprintf(pcVar1,__format,__x);
        return pcVar1;
      }
    }
    else {
      if (p == (printbuffer *)0x0) {
        pcVar1 = (char *)(*cJSON_malloc)(0x15);
      }
      else {
        pcVar1 = ensure(p,0x15);
      }
      if (pcVar1 != (char *)0x0) {
        sprintf(pcVar1,"%d",(ulong)(uint)item->valueint);
        return pcVar1;
      }
    }
  }
  else {
    if (p == (printbuffer *)0x0) {
      pcVar1 = (char *)(*cJSON_malloc)(2);
    }
    else {
      pcVar1 = ensure(p,2);
    }
    if (pcVar1 != (char *)0x0) {
      pcVar1[0] = '0';
      pcVar1[1] = '\0';
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *print_number(cJSON *item,printbuffer *p)
{
	char *str=0;
	double d=item->valuedouble;
	if (d==0)
	{
		if (p)	str=ensure(p,2);
		else	str=(char*)cJSON_malloc(2);	/* special case for 0. */
		if (str) strcpy(str,"0");
	}
	else if (fabs(((double)item->valueint)-d)<=DBL_EPSILON && d<=INT_MAX && d>=INT_MIN)
	{
		if (p)	str=ensure(p,21);
		else	str=(char*)cJSON_malloc(21);	/* 2^64+1 can be represented in 21 chars. */
		if (str)	sprintf(str,"%d",item->valueint);
	}
	else
	{
		if (p)	str=ensure(p,64);
		else	str=(char*)cJSON_malloc(64);	/* This is a nice tradeoff. */
		if (str)
		{
			if (fabs(floor(d)-d)<=DBL_EPSILON && fabs(d)<1.0e60)sprintf(str,"%.0f",d);
			else if (fabs(d)<1.0e-6 || fabs(d)>1.0e9)			sprintf(str,"%e",d);
			else												sprintf(str,"%f",d);
		}
	}
	return str;
}